

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::CaseTreeNode::addChild(CaseTreeNode *this,CaseTreeNode *child)

{
  CaseTreeNode *local_18;
  CaseTreeNode *child_local;
  CaseTreeNode *this_local;
  
  local_18 = child;
  child_local = this;
  std::vector<tcu::CaseTreeNode_*,_std::allocator<tcu::CaseTreeNode_*>_>::push_back
            (&this->m_children,&local_18);
  return;
}

Assistant:

void								addChild			(CaseTreeNode* child) { m_children.push_back(child); }